

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

void __thiscall
gl4cts::ShaderSubroutine::NegativeTest8::NegativeTest8(NegativeTest8 *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"subroutine_wo_body",
             "Verifies that a compile- or link-time error occurs if a function declared as a subroutine does not include a body."
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_0211ec78;
  this->m_fs_id = 0;
  this->m_gs_id = 0;
  this->m_has_test_passed = true;
  this->m_po_id = 0;
  this->m_tc_id = 0;
  this->m_te_id = 0;
  this->m_vs_id = 0;
  return;
}

Assistant:

NegativeTest8::NegativeTest8(deqp::Context& context)
	: TestCase(context, "subroutine_wo_body", "Verifies that a compile- or link-time error occurs if a function "
											  "declared as a subroutine does not include a body.")
	, m_fs_id(0)
	, m_gs_id(0)
	, m_has_test_passed(true)
	, m_po_id(0)
	, m_tc_id(0)
	, m_te_id(0)
	, m_vs_id(0)
{
	/* Left blank intentionally */
}